

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::DoQuadEnvPoint(CEditor *this,CQuad *pQuad,int QIndex,int PIndex)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  CEnvelope *pCVar4;
  CEnvPoint *pCVar5;
  CEnvPoint *pCVar6;
  CEnvPoint *pCVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  _func_int **pp_Var11;
  long in_FS_OFFSET;
  float fVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->m_UI).m_MouseWorldX;
  uVar3 = (this->m_UI).m_MouseWorldY;
  pCVar4 = (this->m_Map).m_lEnvelopes.list[pQuad->m_PosEnv];
  pCVar5 = (pCVar4->m_lPoints).list;
  pCVar7 = pCVar5 + PIndex;
  uVar2 = *(undefined8 *)pCVar5[PIndex].super_CEnvPoint_v1.m_aValues;
  fVar14 = (float)(int)uVar2 * 0.0009765625 + (float)pQuad->m_aPoints[4].x * 0.0009765625;
  fVar16 = (float)(int)((ulong)uVar2 >> 0x20) * 0.0009765625 +
           (float)pQuad->m_aPoints[4].y * 0.0009765625;
  fVar15 = (fVar14 - (float)uVar1) / this->m_WorldZoom;
  fVar12 = (fVar16 - (float)uVar3) / this->m_WorldZoom;
  if ((fVar15 * fVar15 + fVar12 * fVar12 < 50.0) && ((this->m_UI).m_pActiveItem == (void *)0x0)) {
    (this->m_UI).m_ActiveItemValid = true;
    (this->m_UI).m_pBecommingHotItem = pCVar7;
    DoQuadEnvPoint::s_ActQIndex = QIndex;
  }
  iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
  cVar8 = '\x01';
  if ((char)iVar9 == '\0') {
    iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166);
    cVar8 = (char)iVar9;
  }
  pCVar6 = (CEnvPoint *)(this->m_UI).m_pActiveItem;
  if (pCVar6 == pCVar7) {
    (this->m_UI).m_ActiveItemValid = true;
  }
  if (DoQuadEnvPoint::s_ActQIndex == QIndex && pCVar6 == pCVar7) {
    if (DoQuadEnvPoint::s_Operation == 2) {
      pCVar7 = (pCVar4->m_lPoints).list;
      pCVar7[PIndex].super_CEnvPoint_v1.m_aValues[2] =
           (int)(this->m_MouseDeltaX * 10.0 + (float)pCVar7[PIndex].super_CEnvPoint_v1.m_aValues[2])
      ;
    }
    else if (DoQuadEnvPoint::s_Operation == 1) {
      if (cVar8 == '\0' && this->m_GridActive == true) {
        iVar9 = this->m_ZoomLevel;
        uVar10 = 0x10;
        if ((((100 < iVar9) && (uVar10 = 0x20, 0xfa < iVar9)) && (uVar10 = 0x40, 0x1c2 < iVar9)) &&
           (uVar10 = 0x80, 0x352 < iVar9)) {
          uVar10 = (uint)(0x60e < iVar9) * 0x100 + 0x100;
        }
        fVar12 = (float)(int)(this->m_GridFactor * (uVar10 >> 1));
        fVar15 = (float)(int)((uVar10 >> 1) * this->m_GridFactor);
        auVar17._0_4_ =
             (float)((uint)-fVar12 & -(uint)((float)uVar1 < 0.0) |
                    ~-(uint)((float)uVar1 < 0.0) & (uint)fVar12) + (float)uVar1;
        auVar17._4_4_ =
             (float)((uint)-fVar15 & -(uint)((float)uVar3 < 0.0) |
                    ~-(uint)((float)uVar3 < 0.0) & (uint)fVar15) + (float)uVar3;
        auVar17._8_8_ = 0;
        iVar9 = this->m_GridFactor * uVar10;
        iVar13 = this->m_GridFactor * uVar10;
        auVar18._0_4_ = (float)iVar9;
        auVar18._4_4_ = (float)iVar13;
        auVar18._8_8_ = 0;
        auVar18 = divps(auVar17,auVar18);
        *(ulong *)(pCVar4->m_lPoints).list[PIndex].super_CEnvPoint_v1.m_aValues =
             CONCAT44((int)((float)((int)auVar18._4_4_ * iVar13) * 1024.0),
                      (int)((float)(iVar9 * (int)auVar18._0_4_) * 1024.0));
      }
      else {
        pCVar7 = (pCVar4->m_lPoints).list;
        uVar2 = *(undefined8 *)pCVar7[PIndex].super_CEnvPoint_v1.m_aValues;
        *(ulong *)pCVar7[PIndex].super_CEnvPoint_v1.m_aValues =
             CONCAT44((int)((ulong)uVar2 >> 0x20) +
                      (int)(((float)uVar3 - DoQuadEnvPoint::s_LastWy) * 1024.0),
                      (int)uVar2 + (int)(((float)uVar1 - DoQuadEnvPoint::s_LastWx) * 1024.0));
      }
    }
    DoQuadEnvPoint::s_LastWx = (float)uVar1;
    DoQuadEnvPoint::s_LastWy = (float)uVar3;
    if (((this->m_UI).m_MouseButtons & 1) == 0) {
      this->m_LockMouse = false;
      DoQuadEnvPoint::s_Operation = 0;
      (this->m_UI).m_ActiveItemValid = true;
      (this->m_UI).m_pActiveItem = (void *)0x0;
    }
    pp_Var11 = (this->m_pGraphics->super_IInterface)._vptr_IInterface;
  }
  else {
    if ((CEnvPoint *)(this->m_UI).m_pHotItem == pCVar7 && DoQuadEnvPoint::s_ActQIndex == QIndex) {
      ms_pUiGotContext = pCVar7;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
      this->m_pTooltip = "Left mouse button to move. Hold ctrl to rotate. Hold alt to ignore grid.";
      if (((this->m_UI).m_MouseButtons & 1) == 0) {
        this->m_SelectedEnvelopePoint = -1;
        this->m_SelectedQuadEnvelope = -1;
        goto LAB_00199873;
      }
      iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x160);
      if ((char)iVar9 == '\0') {
        iVar9 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x164);
        DoQuadEnvPoint::s_Operation = 1;
        if ((char)iVar9 != '\0') goto LAB_001996a1;
      }
      else {
LAB_001996a1:
        this->m_LockMouse = true;
        DoQuadEnvPoint::s_Operation = 2;
      }
      this->m_SelectedEnvelopePoint = PIndex;
      this->m_SelectedQuadEnvelope = pQuad->m_PosEnv;
      (this->m_UI).m_ActiveItemValid = true;
      (this->m_UI).m_pActiveItem = pCVar7;
      if (pCVar5 != (CEnvPoint *)0x0) {
        (this->m_UI).m_pLastActiveItem = pCVar7;
      }
      if (this->m_SelectedQuad != QIndex) {
        this->m_SelectedPoints = 0;
      }
      this->m_SelectedQuad = QIndex;
      DoQuadEnvPoint::s_LastWx = (float)uVar1;
      DoQuadEnvPoint::s_LastWy = (float)uVar3;
      goto LAB_00199873;
    }
    pp_Var11 = (this->m_pGraphics->super_IInterface)._vptr_IInterface;
  }
  (*pp_Var11[0x21])();
LAB_00199873:
  local_40 = this->m_WorldZoom * 5.0;
  local_48 = CONCAT44(fVar16,fVar14);
  local_3c = local_40;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::DoQuadEnvPoint(const CQuad *pQuad, int QIndex, int PIndex)
{
	enum
	{
		OP_NONE=0,
		OP_MOVE,
		OP_ROTATE,
	};

	// some basic values
	static float s_LastWx;
	static float s_LastWy;
	static int s_Operation = OP_NONE;
	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();
	CEnvelope *pEnvelope = m_Map.m_lEnvelopes[pQuad->m_PosEnv];
	void *pID = &pEnvelope->m_lPoints[PIndex];
	static int s_ActQIndex = -1;

	// get pivot
	float CenterX = fx2f(pQuad->m_aPoints[4].x)+fx2f(pEnvelope->m_lPoints[PIndex].m_aValues[0]);
	float CenterY = fx2f(pQuad->m_aPoints[4].y)+fx2f(pEnvelope->m_lPoints[PIndex].m_aValues[1]);

	float dx = (CenterX - wx)/m_WorldZoom;
	float dy = (CenterY - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50.0f && UI()->CheckActiveItem(0))
	{
		UI()->SetHotItem(pID);
		s_ActQIndex = QIndex;
	}

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	if(UI()->CheckActiveItem(pID) && s_ActQIndex == QIndex)
	{
		if(s_Operation == OP_MOVE)
		{
			if(m_GridActive && !IgnoreGrid)
			{
				int LineDistance = GetLineDistance();

				float x = 0.0f;
				float y = 0.0f;
				if(wx >= 0)
					x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
				else
					x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
				if(wy >= 0)
					y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
				else
					y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

				pEnvelope->m_lPoints[PIndex].m_aValues[0] = f2fx(x);
				pEnvelope->m_lPoints[PIndex].m_aValues[1] = f2fx(y);
			}
			else
			{
				pEnvelope->m_lPoints[PIndex].m_aValues[0] += f2fx(wx-s_LastWx);
				pEnvelope->m_lPoints[PIndex].m_aValues[1] += f2fx(wy-s_LastWy);
			}
		}
		else if(s_Operation == OP_ROTATE)
			pEnvelope->m_lPoints[PIndex].m_aValues[2] += 10*m_MouseDeltaX;

		s_LastWx = wx;
		s_LastWy = wy;

		if(!UI()->MouseButton(0))
		{
			m_LockMouse = false;
			s_Operation = OP_NONE;
			UI()->SetActiveItem(0);
		}

		Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	}
	else if(UI()->HotItem() == pID && s_ActQIndex == QIndex)
	{
		ms_pUiGotContext = pID;

		Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
		m_pTooltip = "Left mouse button to move. Hold ctrl to rotate. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			if(Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))
			{
				m_LockMouse = true;
				s_Operation = OP_ROTATE;
			}
			else
				s_Operation = OP_MOVE;

			m_SelectedEnvelopePoint = PIndex;
			m_SelectedQuadEnvelope = pQuad->m_PosEnv;

			UI()->SetActiveItem(pID);
			if(m_SelectedQuad != QIndex)
				m_SelectedPoints = 0;
			m_SelectedQuad = QIndex;
			s_LastWx = wx;
			s_LastWy = wy;
		}
		else
		{
			m_SelectedEnvelopePoint = -1;
			m_SelectedQuadEnvelope = -1;
		}
	}
	else
		Graphics()->SetColor(0.0f, 1.0f, 0.0f, 1.0f);

	IGraphics::CQuadItem QuadItem(CenterX, CenterY, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}